

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int ON_RowReduce(int row_count,int col_count,double zero_pivot,double **A,double **B,double *pivots)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  ulong local_80;
  double local_68;
  
  uVar7 = (ulong)(uint)row_count;
  if (pivots != (double *)0x0) {
    *pivots = 0.0;
    pivots[1] = 0.0;
  }
  if ((zero_pivot <= 0.0) || (bVar5 = ON_IsValid(zero_pivot), !bVar5)) {
    zero_pivot = 0.0;
  }
  uVar13 = 0;
  local_80 = 0;
  if (0 < row_count) {
    local_80 = (ulong)(uint)row_count;
  }
  for (; local_80 != uVar13; uVar13 = uVar13 + 1) {
    memset(B[uVar13],0,(long)col_count * 8);
    if ((long)uVar13 < (long)col_count) {
      B[uVar13][uVar13] = 1.0;
    }
  }
  dVar16 = **A;
  lVar14 = 1;
  uVar13 = 0;
  local_68 = dVar16;
  do {
    if (uVar13 == local_80) {
LAB_0050c2ab:
      if (pivots != (double *)0x0) {
        *pivots = dVar16;
        pivots[1] = local_68;
      }
      if ((long)row_count <= (long)uVar13) {
        while (iVar8 = (int)uVar7, local_80._0_4_ = row_count, 0 < iVar8) {
          uVar7 = uVar7 - 1;
          for (uVar9 = iVar8 - 2; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
            dVar16 = A[uVar9][uVar7];
            if ((dVar16 != 0.0) || (NAN(dVar16))) {
              pdVar6 = B[uVar7];
              pdVar2 = B[uVar9];
              for (lVar14 = 0; col_count != (int)lVar14; lVar14 = lVar14 + 1) {
                pdVar2[lVar14] = pdVar6[lVar14] * -dVar16 + pdVar2[lVar14];
              }
            }
          }
        }
      }
      return (int)local_80;
    }
    pdVar6 = A[uVar13];
    dVar1 = pdVar6[uVar13];
    dVar15 = ABS(dVar1);
    dVar4 = dVar15;
    if ((dVar16 <= dVar15) && (dVar4 = dVar16, local_68 < dVar15)) {
      local_68 = dVar15;
    }
    dVar16 = dVar4;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      if (dVar15 <= zero_pivot) {
        local_80 = uVar13 & 0xffffffff;
        goto LAB_0050c2ab;
      }
      bVar5 = ON_IsValid(dVar1);
      if (!bVar5) {
        local_80 = uVar13 & 0xffffffff;
        goto LAB_0050c2ab;
      }
      pdVar6 = A[uVar13];
      for (uVar10 = uVar13; col_count + -1 != (int)uVar10; uVar10 = uVar10 + 1) {
        pdVar6[uVar10 + 1] = pdVar6[uVar10 + 1] * (1.0 / dVar1);
      }
      pdVar2 = B[uVar13];
      for (lVar11 = 0; (int)uVar13 + 1 != (int)lVar11; lVar11 = lVar11 + 1) {
        pdVar2[lVar11] = pdVar2[lVar11] * (1.0 / dVar1);
      }
    }
    uVar10 = uVar13 + 1;
    for (lVar11 = lVar14; (int)lVar11 < row_count; lVar11 = lVar11 + 1) {
      pdVar2 = A[lVar11];
      dVar1 = pdVar2[uVar13];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        for (lVar12 = 0; col_count - ((int)uVar13 + 1) != (int)lVar12; lVar12 = lVar12 + 1) {
          pdVar2[uVar10 + lVar12] = pdVar6[uVar10 + lVar12] * -dVar1 + pdVar2[uVar10 + lVar12];
        }
        pdVar2 = B[uVar13];
        pdVar3 = B[lVar11];
        for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
          pdVar3[lVar12] = pdVar2[lVar12] * -dVar1 + pdVar3[lVar12];
        }
      }
    }
    lVar14 = lVar14 + 1;
    uVar13 = uVar10;
  } while( true );
}

Assistant:

int ON_RowReduce( int row_count, 
                  int col_count,
                  double zero_pivot,
                  double** A, 
                  double** B, 
                  double pivots[2] 
                 )
{
  // returned A is identity, B = inverse of input A
  const int M = row_count;
  const int N = col_count;
  const size_t sizeof_row = N*sizeof(A[0][0]);
  int i, j, ii;
  double a, p, p0, p1;
  const double* ptr0;
  double* ptr1;

  if ( pivots )
  {
    pivots[0] = 0.0;
    pivots[1] = 0.0;
  }

  if ( zero_pivot <= 0.0 || !ON_IsValid(zero_pivot) )
    zero_pivot = 0.0;


  for ( i = 0; i < M; i++ )
  {
    memset(B[i],0,sizeof_row);
    if ( i < N )
      B[i][i] = 1.0;
  }

  p0 = p1 = A[0][0];

  for ( i = 0; i < M; i++ )
  {
    p = fabs(a = A[i][i]);
    if ( p < p0 ) p0 = p; else if (p > p1) p1 = p;
    if ( 1.0 != a )
    {
      if ( p <= zero_pivot || !ON_IsValid(a) )
      {
        break;
      }
      a = 1.0/a;

      //A[i][i] = 1.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = i+1; j < N; j++ )
      //  A[i][j] *= a;
      //      
      j = i+1;
      ptr1 = A[i] + j;
      j = N - j;
      while(j--) *ptr1++ *= a;
      
      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = 0; j <= i; j++ )
      //  B[i][j] *= a;
      //            
      ptr1 = B[i];
      j = i+1;
      while(j--) *ptr1++ *= a;
    }

    for ( ii = i+1; ii < M; ii++ )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      
      //A[ii][i] = 0.0;  // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = i+1; j < N; j++ )
      //  A[ii][j] += a*A[i][j];
      //
      j = i+1;
      ptr0 = A[i] + j;
      ptr1 = A[ii] + j;
      j = N - j;
      while(j--) *ptr1++ += a* *ptr0++;

      for( j = 0; j <= i; j++ )
        B[ii][j] += a*B[i][j];
    }
  }

  if ( pivots )
  {
    pivots[0] = p0;
    pivots[1] = p1;
  }

  if ( i < M )
  {
    return i;
  }


  // A is now upper triangular with all 1s on diagonal 
  //   (That is, if the lines that say "no need to do this" are used.)
  // B is lower triangular with a nonzero diagonal
  for ( i = M-1; i >= 0; i-- )
  {
    for ( ii = i-1; ii >= 0; ii-- )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      //A[ii][i] = 0.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = 0; j < N; j++ )
      //  B[ii][j] += a*B[i][j];
      //
      ptr0 = B[i];
      ptr1 = B[ii];
      j = N;
      while(j--) *ptr1++ += a* *ptr0++;
    }
  }

  // At this point, A is trash.
  // If the input A was really nice (positive definite....)
  // the B = inverse of the input A.  If A was not nice,
  // B is also trash.
  return M;
}